

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O2

int Test_SUNMatScaleAddI(SUNMatrix A,SUNMatrix I,int myid)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  SUNMatrix A_00;
  
  A_00 = (SUNMatrix)SUNMatClone();
  uVar2 = SUNMatCopy(I,A_00);
  if (uVar2 != 0) {
    iVar3 = 1;
    if (print_all_ranks != 0 || myid != 0) {
      if (print_all_ranks == 0) goto LAB_0010492c;
      printf("process %06d: ",(ulong)(uint)myid);
    }
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar2);
    goto LAB_0010492c;
  }
  uVar2 = SUNMatScaleAddI(0xbff0000000000000,A_00);
  sync_device(A_00);
  if (uVar2 == 0) {
    iVar3 = check_matrix_entry(A_00,0.0,2.220446049250313e-15);
    if (iVar3 == 0) {
      if (print_all_ranks == 0 && myid == 0) {
LAB_001048ff:
        puts("    PASSED test -- SUNMatScaleAddI ");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)(uint)myid);
        goto LAB_001048ff;
      }
      iVar3 = 0;
      iVar1 = 0;
      if (myid != 0) goto LAB_0010492c;
    }
    else {
      if (print_all_ranks == 0 && myid == 0) {
LAB_001048d3:
        puts(">>> FAILED test -- SUNMatScaleAddI check ");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)(uint)myid);
        goto LAB_001048d3;
      }
      iVar1 = 1;
    }
    iVar3 = iVar1;
    if (print_time != 0) {
      printf("    SUNMatScaleAddI Time: %22.15e \n \n",0);
    }
    goto LAB_0010492c;
  }
  if (print_all_ranks == 0 && myid == 0) {
LAB_00104882:
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar2);
  }
  else if (print_all_ranks != 0) {
    printf("process %06d: ",(ulong)(uint)myid);
    goto LAB_00104882;
  }
  iVar3 = 1;
LAB_0010492c:
  SUNMatDestroy(A_00);
  return iVar3;
}

Assistant:

int Test_SUNMatScaleAddI(SUNMatrix A, SUNMatrix I, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  /* protect A */
  B = SUNMatClone(A);

  failure = SUNMatCopy(I, B);
  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* perform operation */
  start_time = get_time();
  failure    = SUNMatScaleAddI(NEG_ONE, B);
  sync_device(B);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatScaleAddI returned %d \n", failure,
                 myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatScaleAddI check \n", myid);
    PRINT_TIME("    SUNMatScaleAddI Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatScaleAddI \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatScaleAddI Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}